

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O0

void __thiscall
Clasp::SingleOwnerPtr<Potassco::AbstractProgram,_Clasp::DeleteObject>::reset
          (SingleOwnerPtr<Potassco::AbstractProgram,_Clasp::DeleteObject> *this,AbstractProgram *x)

{
  bool bVar1;
  DeleteObject *pDVar2;
  _func_int **pp_Var3;
  DeleteObject *in_RSI;
  AbstractProgram *in_RDI;
  DeleteObject deleter;
  
  pDVar2 = (DeleteObject *)
           get((SingleOwnerPtr<Potassco::AbstractProgram,_Clasp::DeleteObject> *)0x11f8d6);
  if ((in_RSI != pDVar2) &&
     (bVar1 = is_owner((SingleOwnerPtr<Potassco::AbstractProgram,_Clasp::DeleteObject> *)0x11f8ec),
     bVar1)) {
    release((SingleOwnerPtr<Potassco::AbstractProgram,_Clasp::DeleteObject> *)in_RSI);
    DeleteObject::operator()(in_RSI,in_RDI);
  }
  pp_Var3 = (_func_int **)
            set_bit<unsigned_long>((unsigned_long)in_RSI,(uint)((ulong)in_RDI >> 0x20));
  in_RDI->_vptr_AbstractProgram = pp_Var3;
  return;
}

Assistant:

void reset(T* x)             {
		if (x != get() && is_owner()) { D deleter; deleter(release()); }
		ptr_ = set_bit(uintp(x),0);
	}